

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inject_sleigh.cc
# Opt level: O0

void __thiscall ExecutablePcodeSleigh::restoreXml(ExecutablePcodeSleigh *this,Element *el)

{
  bool bVar1;
  reference ppEVar2;
  string *psVar3;
  LowlevelError *this_00;
  undefined1 local_88 [32];
  string local_68 [32];
  Element *local_48;
  Element *subel;
  Element **local_38;
  byte local_29;
  const_iterator cStack_28;
  bool hasbody;
  const_iterator iter;
  List *list;
  Element *el_local;
  ExecutablePcodeSleigh *this_local;
  
  InjectPayload::restoreXml((InjectPayload *)this,el);
  iter._M_current = (Element **)Element::getChildren(el);
  __gnu_cxx::
  __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>::
  __normal_iterator(&stack0xffffffffffffffd8);
  local_29 = 0;
  local_38 = (Element **)std::vector<Element_*,_std::allocator<Element_*>_>::begin(iter._M_current);
  cStack_28 = (const_iterator)local_38;
  while( true ) {
    subel = (Element *)
            std::vector<Element_*,_std::allocator<Element_*>_>::end
                      ((vector<Element_*,_std::allocator<Element_*>_> *)iter._M_current);
    bVar1 = __gnu_cxx::operator!=
                      (&stack0xffffffffffffffd8,
                       (__normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>
                        *)&subel);
    if (!bVar1) break;
    ppEVar2 = __gnu_cxx::
              __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>
              ::operator*(&stack0xffffffffffffffd8);
    local_48 = *ppEVar2;
    psVar3 = Element::getName_abi_cxx11_(local_48);
    bVar1 = std::operator==(psVar3,"body");
    if (bVar1) {
      local_29 = 1;
      psVar3 = Element::getContent_abi_cxx11_(local_48);
      std::__cxx11::string::operator=((string *)&this->parsestring,(string *)psVar3);
    }
    __gnu_cxx::
    __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>::
    operator++(&stack0xffffffffffffffd8);
  }
  if ((local_29 & 1) != 0) {
    return;
  }
  this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
  (*(this->super_ExecutablePcode).super_InjectPayload._vptr_InjectPayload[5])(local_88);
  std::operator+((char *)local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "Missing <body> subtag in <pcode>: ");
  LowlevelError::LowlevelError(this_00,local_68);
  __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void ExecutablePcodeSleigh::restoreXml(const Element *el)

{
  InjectPayload::restoreXml(el);
  const List &list(el->getChildren());
  List::const_iterator iter;
  bool hasbody = false;
  for (iter = list.begin(); iter != list.end(); ++iter) {
    const Element *subel = *iter;
    if (subel->getName() == "body") {
      hasbody = true;
      parsestring = subel->getContent();
    }
  }
  if (!hasbody)
    throw LowlevelError("Missing <body> subtag in <pcode>: " + getSource());
}